

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardSimulationDataGenerator.cpp
# Opt level: O0

U32 __thiscall
PS2KeyboardSimulationDataGenerator::GenerateSimulationData
          (PS2KeyboardSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channels)

{
  double dVar1;
  U32 UVar2;
  ulong uVar3;
  ulong uVar4;
  SimulationChannelDescriptor *pSVar5;
  U64 adjusted_largest_sample_requested;
  SimulationChannelDescriptor **simulation_channels_local;
  U32 sample_rate_local;
  U64 largest_sample_requested_local;
  PS2KeyboardSimulationDataGenerator *this_local;
  
  uVar3 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  while (uVar4 = SimulationChannelDescriptor::GetCurrentSampleNumber(), uVar4 < uVar3) {
    dVar1 = this->mSettings->mDeviceType;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      SendMovementPacket(this,this->mSettings->mDeviceType);
      SendMovementPacket(this,this->mSettings->mDeviceType);
      SendMovementPacket(this,this->mSettings->mDeviceType);
      SendMovementPacket(this,this->mSettings->mDeviceType);
      SendMovementPacket(this,this->mSettings->mDeviceType);
      HostSendByte(this,0xe7);
      SendByte(this,0xfa);
      HostSendByte(this,0xe6);
      SendByte(this,0xfa);
      HostSendByte(this,0xe8);
      SendByte(this,0xfa);
      HostSendByte(this,'\x03');
      SendByte(this,0xfa);
      HostSendByte(this,0xe9);
      SendByte(this,0xfa);
      SendByte(this,'w');
      SendByte(this,'\x03');
      SendByte(this,'d');
      HostSendByte(this,0xea);
      SendByte(this,0xfa);
      HostSendByte(this,0xeb);
      SendByte(this,0xfa);
      SendMovementPacket(this,this->mSettings->mDeviceType);
      HostSendByte(this,0xec);
      SendByte(this,0xfa);
      HostSendByte(this,0xee);
      SendByte(this,0xfa);
      HostSendByte(this,0xf0);
      SendByte(this,0xfa);
      HostSendByte(this,0xf2);
      SendByte(this,0xfa);
      SendMouseDeviceID(this,this->mSettings->mDeviceType);
      HostSendByte(this,0xf3);
      SendByte(this,0xfa);
      HostSendByte(this,'d');
      SendByte(this,0xfa);
      HostSendByte(this,0xf4);
      SendByte(this,0xfa);
      HostSendByte(this,0xf5);
      SendByte(this,0xfa);
      HostSendByte(this,0xf6);
      SendByte(this,0xfa);
      HostSendByte(this,0xfe);
      SendByte(this,0xfa);
      SendMovementPacket(this,this->mSettings->mDeviceType);
      HostSendByte(this,0xff);
      SendByte(this,0xfa);
      SendByte(this,0xaa);
      SendMouseDeviceID(this,this->mSettings->mDeviceType);
    }
    else {
      ClockGenerator::AdvanceByHalfPeriod(1.0);
      SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x10);
      SendStandardKey(this,'\x05');
      SendStandardKey(this,'\x06');
      SendStandardKey(this,'\x04');
      SendStandardKey(this,'\f');
      SendStandardKey(this,'\x03');
      SendStandardKey(this,'\v');
      SendStandardKey(this,0x83);
      SendStandardKey(this,'\n');
      SendStandardKey(this,'\x01');
      SendStandardKey(this,'\t');
      SendStandardKey(this,'x');
      SendStandardKey(this,'\a');
      SendStandardKey(this,'v');
      SendStandardKey(this,'~');
      SendStandardKey(this,'\x0e');
      SendStandardKey(this,'N');
      SendStandardKey(this,'U');
      SendStandardKey(this,'f');
      SendStandardKey(this,'\r');
      SendStandardKey(this,'T');
      SendStandardKey(this,'[');
      SendStandardKey(this,']');
      SendStandardKey(this,'X');
      SendStandardKey(this,'L');
      SendStandardKey(this,'R');
      SendStandardKey(this,'Z');
      SendStandardKey(this,'A');
      SendStandardKey(this,'I');
      SendStandardKey(this,'J');
      SendStandardKey(this,'\x12');
      SendStandardKey(this,'Y');
      SendStandardKey(this,'\x14');
      SendStandardKey(this,'\x11');
      SendStandardKey(this,')');
      SendStandardKey(this,'|');
      SendStandardKey(this,'w');
      SendStandardKey(this,'i');
      SendStandardKey(this,'r');
      SendStandardKey(this,'z');
      SendStandardKey(this,'k');
      SendStandardKey(this,'s');
      SendStandardKey(this,'t');
      SendStandardKey(this,'l');
      SendStandardKey(this,'u');
      SendStandardKey(this,'}');
      SendStandardKey(this,'p');
      SendStandardKey(this,'q');
      SendStandardKey(this,'y');
      SendStandardKey(this,'{');
      SendStandardKey(this,'\x15');
      SendStandardKey(this,'\x1d');
      SendStandardKey(this,'$');
      SendStandardKey(this,'-');
      SendStandardKey(this,',');
      SendStandardKey(this,'5');
      SendStandardKey(this,'<');
      SendStandardKey(this,'C');
      SendStandardKey(this,'D');
      SendStandardKey(this,'M');
      SendStandardKey(this,'\x1c');
      SendStandardKey(this,'\x1b');
      SendStandardKey(this,'#');
      SendStandardKey(this,'+');
      SendStandardKey(this,'4');
      SendStandardKey(this,'3');
      SendStandardKey(this,';');
      SendStandardKey(this,'B');
      SendStandardKey(this,'K');
      SendStandardKey(this,'\x1a');
      SendStandardKey(this,'\"');
      SendStandardKey(this,'!');
      SendStandardKey(this,'*');
      SendStandardKey(this,'2');
      SendStandardKey(this,'1');
      SendStandardKey(this,':');
      SendStandardKey(this,'\x16');
      SendStandardKey(this,'\x1e');
      SendStandardKey(this,'&');
      SendStandardKey(this,'%');
      SendStandardKey(this,'.');
      SendStandardKey(this,'6');
      SendStandardKey(this,'=');
      SendStandardKey(this,'>');
      SendStandardKey(this,'F');
      SendStandardKey(this,'E');
      SendExtendedKey(this,'\x11');
      SendExtendedKey(this,'\'');
      SendExtendedKey(this,'/');
      SendExtendedKey(this,'p');
      SendExtendedKey(this,'l');
      SendExtendedKey(this,'}');
      SendExtendedKey(this,'q');
      SendExtendedKey(this,'i');
      SendExtendedKey(this,'z');
      SendExtendedKey(this,'u');
      SendExtendedKey(this,'k');
      SendExtendedKey(this,'r');
      SendExtendedKey(this,'t');
      SendExtendedKey(this,'\x14');
      SendExtendedKey(this,'\x1f');
      SendExtendedKey(this,'Z');
      SendExtendedKey(this,'J');
      SendExtendedKey(this,'7');
      SendExtendedKey(this,'?');
      SendExtendedKey(this,'^');
      SendExtendedKey(this,'M');
      SendExtendedKey(this,'\x15');
      SendExtendedKey(this,';');
      SendExtendedKey(this,'4');
      SendExtendedKey(this,'#');
      SendExtendedKey(this,'2');
      SendExtendedKey(this,'!');
      SendExtendedKey(this,'P');
      SendExtendedKey(this,'H');
      SendExtendedKey(this,'+');
      SendExtendedKey(this,'@');
      SendExtendedKey(this,'\x10');
      SendExtendedKey(this,':');
      SendExtendedKey(this,'8');
      SendExtendedKey(this,'0');
      SendExtendedKey(this,'(');
      SendExtendedKey(this,' ');
      SendExtendedKey(this,'\x18');
      SendPauseBreakKey(this);
      SendPrintScreenKey(this);
      HostSendByte(this,0xed);
      SendByte(this,0xfa);
      HostSendByte(this,'\a');
      SendByte(this,0xfa);
      HostSendByte(this,0xee);
      SendByte(this,0xee);
      HostSendByte(this,0xf0);
      SendByte(this,0xfa);
      HostSendByte(this,'\x03');
      SendByte(this,0xfa);
      HostSendByte(this,0xf0);
      SendByte(this,0xfa);
      HostSendByte(this,'\x02');
      SendByte(this,0xfa);
      HostSendByte(this,0xf0);
      SendByte(this,0xfa);
      HostSendByte(this,'\x01');
      SendByte(this,0xfa);
      HostSendByte(this,0xf0);
      SendByte(this,0xfa);
      HostSendByte(this,'\0');
      SendByte(this,'\x01');
      HostSendByte(this,0xf2);
      SendByte(this,0xab);
      SendByte(this,0x83);
      HostSendByte(this,0xf3);
      SendByte(this,0xfa);
      HostSendByte(this,'\0');
      SendByte(this,0xfa);
      HostSendByte(this,0xf4);
      HostSendByte(this,0xf5);
      HostSendByte(this,0xf6);
      SendByte(this,0xfa);
      HostSendByte(this,0xf7);
      SendByte(this,0xfa);
      HostSendByte(this,0xf8);
      SendByte(this,0xfa);
      HostSendByte(this,0xf9);
      SendByte(this,0xfa);
      HostSendByte(this,0xfa);
      SendByte(this,0xfa);
      HostSendByte(this,0xfb);
      SendByte(this,0xfa);
      HostSendByte(this,'\x1a');
      SendByte(this,0xfa);
      HostSendByte(this,0xee);
      SendByte(this,0xee);
      HostSendByte(this,0xfc);
      SendByte(this,0xfa);
      HostSendByte(this,'\x1a');
      SendByte(this,0xfa);
      HostSendByte(this,0xee);
      SendByte(this,0xee);
      HostSendByte(this,0xfd);
      SendByte(this,0xfa);
      HostSendByte(this,'\x1a');
      SendByte(this,0xfa);
      HostSendByte(this,0xee);
      SendByte(this,0xee);
      HostSendByte(this,0xfe);
      SendByte(this,'\x05');
      HostSendByte(this,0xff);
      SendByte(this,0xfa);
      SendByte(this,0xaa);
    }
  }
  pSVar5 = (SimulationChannelDescriptor *)SimulationChannelDescriptorGroup::GetArray();
  *simulation_channels = pSVar5;
  UVar2 = SimulationChannelDescriptorGroup::GetCount();
  return UVar2;
}

Assistant:

U32 PS2KeyboardSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                                SimulationChannelDescriptor** simulation_channels )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mData->GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        if( mSettings->mDeviceType == 0 )
        {
            // simulate a keyboard
            // begin with device to host transmission
            mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

            // Standard Keys
            SendStandardKey( KEY_F1 );
            SendStandardKey( KEY_F2 );
            SendStandardKey( KEY_F3 );
            SendStandardKey( KEY_F4 );
            SendStandardKey( KEY_F5 );
            SendStandardKey( KEY_F6 );
            SendStandardKey( KEY_F7 );
            SendStandardKey( KEY_F8 );
            SendStandardKey( KEY_F9 );
            SendStandardKey( KEY_F10 );
            SendStandardKey( KEY_F11 );
            SendStandardKey( KEY_F12 );

            SendStandardKey( KEY_ESC );
            SendStandardKey( KEY_SCROLLLOCK );
            SendStandardKey( KEY_ACCENT );
            SendStandardKey( KEY_MINUS );
            SendStandardKey( KEY_EQUAL );
            SendStandardKey( KEY_BACKSPACE );
            SendStandardKey( KEY_TAB );
            SendStandardKey( KEY_LBRACE );
            SendStandardKey( KEY_RBRACE );
            SendStandardKey( KEY_BSLASH );
            SendStandardKey( KEY_CAPSLOCK );
            SendStandardKey( KEY_COLON );
            SendStandardKey( KEY_QUOTE );
            SendStandardKey( KEY_ENTER );
            SendStandardKey( KEY_COMMA );
            SendStandardKey( KEY_PERIOD );
            SendStandardKey( KEY_FSLASH );

            SendStandardKey( KEY_LSHIFT );
            SendStandardKey( KEY_RSHIFT );
            SendStandardKey( KEY_LCONTROL );
            SendStandardKey( KEY_LALT );
            SendStandardKey( KEY_SPACE );
            SendStandardKey( KEY_ASTERISK );
            SendStandardKey( KEY_NUMLOCK );

            SendStandardKey( KEY_NUMPAD_1 );
            SendStandardKey( KEY_NUMPAD_2 );
            SendStandardKey( KEY_NUMPAD_3 );
            SendStandardKey( KEY_NUMPAD_4 );
            SendStandardKey( KEY_NUMPAD_5 );
            SendStandardKey( KEY_NUMPAD_6 );
            SendStandardKey( KEY_NUMPAD_7 );
            SendStandardKey( KEY_NUMPAD_8 );
            SendStandardKey( KEY_NUMPAD_9 );
            SendStandardKey( KEY_NUMPAD_0 );
            SendStandardKey( KEY_NUMPAD_DECIMAL );
            SendStandardKey( KEY_NUMPAD_PLUS );
            SendStandardKey( KEY_NUMPAD_MINUS );

            SendStandardKey( KEY_Q );
            SendStandardKey( KEY_W );
            SendStandardKey( KEY_E );
            SendStandardKey( KEY_R );
            SendStandardKey( KEY_T );
            SendStandardKey( KEY_Y );
            SendStandardKey( KEY_U );
            SendStandardKey( KEY_I );
            SendStandardKey( KEY_O );
            SendStandardKey( KEY_P );

            SendStandardKey( KEY_A );
            SendStandardKey( KEY_S );
            SendStandardKey( KEY_D );
            SendStandardKey( KEY_F );
            SendStandardKey( KEY_G );
            SendStandardKey( KEY_H );
            SendStandardKey( KEY_J );
            SendStandardKey( KEY_K );
            SendStandardKey( KEY_L );

            SendStandardKey( KEY_Z );
            SendStandardKey( KEY_X );
            SendStandardKey( KEY_C );
            SendStandardKey( KEY_V );
            SendStandardKey( KEY_B );
            SendStandardKey( KEY_N );
            SendStandardKey( KEY_M );

            SendStandardKey( KEY_1 );
            SendStandardKey( KEY_2 );
            SendStandardKey( KEY_3 );
            SendStandardKey( KEY_4 );
            SendStandardKey( KEY_5 );
            SendStandardKey( KEY_6 );
            SendStandardKey( KEY_7 );
            SendStandardKey( KEY_8 );
            SendStandardKey( KEY_9 );
            SendStandardKey( KEY_0 );

            // Extended Keys
            SendExtendedKey( EXTENDED_RALT );
            SendExtendedKey( EXTENDED_RWINDOWS );
            SendExtendedKey( EXTENDED_MENUS );
            SendExtendedKey( EXTENDED_INSERT );
            SendExtendedKey( EXTENDED_HOME );
            SendExtendedKey( EXTENDED_PAGEUP );
            SendExtendedKey( EXTENDED_DELETE );
            SendExtendedKey( EXTENDED_END );
            SendExtendedKey( EXTENDED_PAGEDOWN );
            SendExtendedKey( EXTENDED_UPARROW );
            SendExtendedKey( EXTENDED_LEFTARROW );
            SendExtendedKey( EXTENDED_DOWNARROW );
            SendExtendedKey( EXTENDED_RIGHTARROW );
            SendExtendedKey( EXTENDED_RCONTROL );
            SendExtendedKey( EXTENDED_LWINDOWS );
            SendExtendedKey( EXTENDED_NUMPAD_ENTER );
            SendExtendedKey( EXTENDED_FSLASH );
            SendExtendedKey( EXTENDED_POWER );
            SendExtendedKey( EXTENDED_SLEEP );
            SendExtendedKey( EXTENDED_WAKE );
            SendExtendedKey( EXTENDED_NEXTTRACK );
            SendExtendedKey( EXTENDED_PREVIOUSTRACK );
            SendExtendedKey( EXTENDED_STOP );
            SendExtendedKey( EXTENDED_PLAYPAUSE );
            SendExtendedKey( EXTENDED_MUTE );
            SendExtendedKey( EXTENDED_VOLUMEUP );
            SendExtendedKey( EXTENDED_VOLUMEDOWN );
            SendExtendedKey( EXTENDED_MEDIASELECT );
            SendExtendedKey( EXTENDED_EMAIL );
            SendExtendedKey( EXTENDED_CALCULATOR );
            SendExtendedKey( EXTENDED_MYCOMPUTER );
            SendExtendedKey( EXTENDED_WWWSEARCH );
            SendExtendedKey( EXTENDED_WWWHOME );
            SendExtendedKey( EXTENDED_WWWBACK );
            SendExtendedKey( EXTENDED_WWWFORWARD );
            SendExtendedKey( EXTENDED_WWWSTOP );
            SendExtendedKey( EXTENDED_WWWREFRESH );
            SendExtendedKey( EXTENDED_FAVORITES );

            // Pause/Break
            SendPauseBreakKey();

            // PrintScreen
            SendPrintScreenKey();

            // Now for the host->device transmissions
            HostSendByte( CMD_WRITE_LEDS );
            SendByte( 0xFA );
            HostSendByte( 0x07 );
            SendByte( 0xFA );

            HostSendByte( CMD_ECHO );
            SendByte( 0xEE );

            HostSendByte( CMD_SET_SCANCODE_SET );
            SendByte( 0xFA );
            HostSendByte( 0x03 );
            SendByte( 0xFA );

            HostSendByte( CMD_SET_SCANCODE_SET );
            SendByte( 0xFA );
            HostSendByte( 0x02 );
            SendByte( 0xFA );

            HostSendByte( CMD_SET_SCANCODE_SET );
            SendByte( 0xFA );
            HostSendByte( 0x01 );
            SendByte( 0xFA );

            HostSendByte( CMD_SET_SCANCODE_SET );
            SendByte( 0xFA );
            HostSendByte( 0x00 );
            SendByte( 0x01 );

            HostSendByte( CMD_READ_ID );
            SendByte( 0xAB );
            SendByte( 0x83 );

            HostSendByte( CMD_SET_REPEAT );
            SendByte( 0xFA );
            HostSendByte( 0x00 );
            SendByte( 0xFA );

            HostSendByte( CMD_KEYBOARD_ENABLE );

            HostSendByte( CMD_KEYBOARD_DISABLE );

            HostSendByte( CMD_SET_DEFAULTS );
            SendByte( 0xFA );

            HostSendByte( CMD_SET_ALL_KEYS_REPEAT );
            SendByte( 0xFA );

            HostSendByte( CMD_SET_ALL_KEYS_MAKEBREAK_CODES );
            SendByte( 0xFA );

            HostSendByte( CMD_SET_ALL_KEYS_MAKE_CODES );
            SendByte( 0xFA );

            HostSendByte( CMD_SET_ALL_REPEAT_AND_MAKEBREAK_CODES );
            SendByte( 0xFA );

            HostSendByte( CMD_SET_SINGLE_REPEAT );
            SendByte( 0xFA );
            HostSendByte( KEY_Z );
            SendByte( 0xFA );
            HostSendByte( CMD_ECHO );
            SendByte( 0xEE );

            HostSendByte( CMD_SET_SINGLE_MAKEBREAK_CODES );
            SendByte( 0xFA );
            HostSendByte( KEY_Z );
            SendByte( 0xFA );
            HostSendByte( CMD_ECHO );
            SendByte( 0xEE );

            HostSendByte( CMD_SET_SINGLE_MAKE_CODES );
            SendByte( 0xFA );
            HostSendByte( KEY_Z );
            SendByte( 0xFA );
            HostSendByte( CMD_ECHO );
            SendByte( 0xEE );

            HostSendByte( CMD_RESEND );
            SendByte( 0x05 );

            HostSendByte( CMD_KEYBOARD_RESET );
            SendByte( 0xFA );
            SendByte( 0xAA );
        }
        else
        {
            // simulate a mouse

            SendMovementPacket( mSettings->mDeviceType );
            SendMovementPacket( mSettings->mDeviceType );
            SendMovementPacket( mSettings->mDeviceType );
            SendMovementPacket( mSettings->mDeviceType );
            SendMovementPacket( mSettings->mDeviceType );

            HostSendByte( MOUSE_CMD_SET_SCALING2to1 );
            SendByte( 0xFA );

            HostSendByte( MOUSE_CMD_SET_SCALING1to1 );
            SendByte( 0xFA );

            HostSendByte( MOUSE_CMD_SET_RESOLUTION );
            SendByte( 0xFA );
            HostSendByte( 0x03 );
            SendByte( 0xFA );

            HostSendByte( MOUSE_CMD_STATUS_REQUEST );
            SendByte( 0xFA );
            SendByte( 0x77 );
            SendByte( 0x03 );
            SendByte( 0x64 );

            HostSendByte( MOUSE_CMD_SET_STREAM_MODE );
            SendByte( 0xFA );

            HostSendByte( MOUSE_CMD_READ_DATA );
            SendByte( 0xFA );
            SendMovementPacket( mSettings->mDeviceType );

            HostSendByte( MOUSE_CMD_RESET_WRAP_MODE );
            SendByte( 0xFA );

            HostSendByte( MOUSE_CMD_SET_WRAP_MODE );
            SendByte( 0xFA );

            HostSendByte( MOUSE_CMD_SET_REMOTE_MODE );
            SendByte( 0xFA );

            HostSendByte( MOUSE_CMD_GET_DEVICE_ID );
            SendByte( 0xFA );
            SendMouseDeviceID( mSettings->mDeviceType );

            HostSendByte( MOUSE_CMD_SET_SAMPLE_RATE );
            SendByte( 0xFA );
            HostSendByte( 0x64 );
            SendByte( 0xFA );

            HostSendByte( MOUSE_CMD_ENABLE_DATA_REPORTING );
            SendByte( 0xFA );

            HostSendByte( MOUSE_CMD_DISABLE_DATA_REPORTING );
            SendByte( 0xFA );

            HostSendByte( MOUSE_CMD_SET_DEFAULTS );
            SendByte( 0xFA );

            HostSendByte( MOUSE_CMD_RESEND );
            SendByte( 0xFA );
            SendMovementPacket( mSettings->mDeviceType );

            HostSendByte( MOUSE_CMD_RESET );
            SendByte( 0xFA );
            SendByte( 0xAA );
            SendMouseDeviceID( mSettings->mDeviceType );
        }
    }

    *simulation_channels = mPS2KeyboardSimulationChannels.GetArray();
    return mPS2KeyboardSimulationChannels.GetCount();
}